

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,ExprList *exprList)

{
  pointer ppEVar1;
  bool bVar2;
  ostream *poVar3;
  Expr **expr;
  pointer Val;
  
  ppEVar1 = (exprList->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (Val = (exprList->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
             super__Vector_impl_data._M_start; Val != ppEVar1; Val = Val + 1) {
    if (!bVar2) {
      indent(this);
    }
    (*(*Val)->_vptr_Expr[2])(*Val,this);
    bVar2 = llvm::isa_impl_wrap<IfExpr,_Expr_*const,_const_Expr_*>::doit(Val);
    if (!bVar2) {
      bVar2 = llvm::isa_impl_wrap<SwitchExpr,_Expr_*const,_const_Expr_*>::doit(Val);
      if (!bVar2) {
        bVar2 = llvm::isa_impl_wrap<ExprList,_Expr_*const,_const_Expr_*>::doit(Val);
        if (!bVar2) {
          poVar3 = std::operator<<(this->ss,";");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
    }
    bVar2 = false;
  }
  return;
}

Assistant:

void ExprWriter::visit(ExprList& exprList) {
    bool first = true;
    for (const auto& expr : exprList.expressions) {
        if (!first)
            indent();
        first = false;
        expr->accept(*this);
        if (!llvm::isa<IfExpr>(expr) && !llvm::isa<SwitchExpr>(expr) && !llvm::isa<ExprList>(expr)) {
            ss << ";" << std::endl;
        }
    }
}